

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

int __thiscall ncnn::MultiHeadAttention::load_model(MultiHeadAttention *this,ModelBin *mb)

{
  Mat local_70;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
  Mat::operator=(&this->q_weight_data,&local_70);
  Mat::~Mat(&local_70);
  if (((this->q_weight_data).data != (void *)0x0) &&
     ((long)(this->q_weight_data).c * (this->q_weight_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
    Mat::operator=(&this->q_bias_data,&local_70);
    Mat::~Mat(&local_70);
    if (((this->q_bias_data).data != (void *)0x0) &&
       ((long)(this->q_bias_data).c * (this->q_bias_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
      Mat::operator=(&this->k_weight_data,&local_70);
      Mat::~Mat(&local_70);
      if (((this->k_weight_data).data != (void *)0x0) &&
         ((long)(this->k_weight_data).c * (this->k_weight_data).cstep != 0)) {
        (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
        Mat::operator=(&this->k_bias_data,&local_70);
        Mat::~Mat(&local_70);
        if (((this->k_bias_data).data != (void *)0x0) &&
           ((long)(this->k_bias_data).c * (this->k_bias_data).cstep != 0)) {
          (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
          Mat::operator=(&this->v_weight_data,&local_70);
          Mat::~Mat(&local_70);
          if (((this->v_weight_data).data != (void *)0x0) &&
             ((long)(this->v_weight_data).c * (this->v_weight_data).cstep != 0)) {
            (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
            Mat::operator=(&this->v_bias_data,&local_70);
            Mat::~Mat(&local_70);
            if (((this->v_bias_data).data != (void *)0x0) &&
               ((long)(this->v_bias_data).c * (this->v_bias_data).cstep != 0)) {
              (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
              Mat::operator=(&this->out_weight_data,&local_70);
              Mat::~Mat(&local_70);
              if (((this->out_weight_data).data != (void *)0x0) &&
                 ((long)(this->out_weight_data).c * (this->out_weight_data).cstep != 0)) {
                (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
                Mat::operator=(&this->out_bias_data,&local_70);
                Mat::~Mat(&local_70);
                if (((this->out_bias_data).data != (void *)0x0) &&
                   ((long)(this->out_bias_data).c * (this->out_bias_data).cstep != 0)) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return -100;
}

Assistant:

int MultiHeadAttention::load_model(const ModelBin& mb)
{
    q_weight_data = mb.load(weight_data_size, 0);
    if (q_weight_data.empty())
        return -100;

    q_bias_data = mb.load(embed_dim, 1);
    if (q_bias_data.empty())
        return -100;

    k_weight_data = mb.load(weight_data_size, 0);
    if (k_weight_data.empty())
        return -100;

    k_bias_data = mb.load(embed_dim, 1);
    if (k_bias_data.empty())
        return -100;

    v_weight_data = mb.load(weight_data_size, 0);
    if (v_weight_data.empty())
        return -100;

    v_bias_data = mb.load(embed_dim, 1);
    if (v_bias_data.empty())
        return -100;

    out_weight_data = mb.load(weight_data_size, 0);
    if (out_weight_data.empty())
        return -100;

    out_bias_data = mb.load(embed_dim, 1);
    if (out_bias_data.empty())
        return -100;

    return 0;
}